

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchive.hpp
# Opt level: O1

ZipEntry __thiscall Zippy::ZipArchive::GetEntry(ZipArchive *this,string *name)

{
  pointer puVar1;
  mz_bool mVar2;
  __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  _Var3;
  logic_error *this_00;
  runtime_error *this_01;
  char *__s;
  undefined8 *in_RDX;
  ZipEntry *extraout_RDX;
  ZipEntry *extraout_RDX_00;
  ZipEntry *extraout_RDX_01;
  ZipEntry *pZVar4;
  ZipEntry ZVar5;
  mz_uint32 file_index;
  allocator<char> local_59;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  pointer local_38;
  
  if (name[4].field_2._M_local_buf[8] == '\0') {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"Cannot call GetEntry on empty ZipArchive object!","");
    std::logic_error::logic_error(this_00,(string *)local_58);
    *(undefined ***)this_00 = &PTR__logic_error_00180de8;
    __cxa_throw(this_00,&ZipLogicError::typeinfo,std::logic_error::~logic_error);
  }
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<Zippy::Impl::ZipEntry*,std::vector<Zippy::Impl::ZipEntry,std::allocator<Zippy::Impl::ZipEntry>>>,__gnu_cxx::__ops::_Iter_pred<Zippy::ZipArchive::GetEntry(std::__cxx11::string_const&)::_lambda(Zippy::Impl::ZipEntry_const&)_1_>>
                    (name[5]._M_dataplus._M_p,name[5]._M_string_length);
  pZVar4 = extraout_RDX;
  if (((_Var3._M_current)->m_EntryData).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      ((_Var3._M_current)->m_EntryData).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&(_Var3._M_current)->m_EntryData,((_Var3._M_current)->m_EntryInfo).m_uncomp_size);
    local_38 = ((_Var3._M_current)->m_EntryData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    puVar1 = ((_Var3._M_current)->m_EntryData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    mVar2 = mz_zip_reader_locate_file_v2
                      ((mz_zip_archive *)&name->_M_string_length,(char *)*in_RDX,(char *)0x0,0,
                       (mz_uint32 *)local_58);
    pZVar4 = extraout_RDX_00;
    if (mVar2 != 0) {
      mz_zip_reader_extract_to_mem_no_alloc
                ((mz_zip_archive *)&name->_M_string_length,(mz_uint)local_58[0],local_38,
                 (long)puVar1 - (long)local_38,0,(void *)0x0,0);
      pZVar4 = extraout_RDX_01;
    }
  }
  if ((((_Var3._M_current)->m_EntryInfo).m_is_directory == 0) &&
     (((_Var3._M_current)->m_EntryData).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0)) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    __s = mz_zip_get_error_string(*(mz_zip_error *)((long)&name[1]._M_dataplus._M_p + 4));
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,__s,&local_59);
    std::runtime_error::runtime_error(this_01,(string *)local_58);
    *(undefined ***)this_01 = &PTR__runtime_error_00180d78;
    __cxa_throw(this_01,&ZipRuntimeError::typeinfo,std::runtime_error::~runtime_error);
  }
  this->_vptr_ZipArchive = (_func_int **)&PTR__ZipEntry_00180e10;
  (this->m_Archive).m_archive_size = (mz_uint64)_Var3._M_current;
  ZVar5.m_ZipEntry = pZVar4;
  ZVar5._vptr_ZipEntry = (_func_int **)this;
  return ZVar5;
}

Assistant:

ZipEntry GetEntry(const std::string& name) {

            if (!IsOpen()) throw ZipLogicError("Cannot call GetEntry on empty ZipArchive object!");

            // ===== Look up ZipEntry object.
            auto result = std::find_if(m_ZipEntries.begin(), m_ZipEntries.end(), [&](const Impl::ZipEntry& entry) {
                return name == entry.GetName();
            });

            // ===== If data has not been extracted from the archive (i.e., m_EntryData is empty),
            // ===== extract the data from the archive to the ZipEntry object.
            if (result->m_EntryData.empty()) {
                result->m_EntryData.resize(result->UncompressedSize());
                mz_zip_reader_extract_file_to_mem(&m_Archive, name.c_str(), result->m_EntryData.data(),
                                                  result->m_EntryData.size(), 0);
            }

            // ===== Check that the operation was successful
            if (!result->IsDirectory() && result->m_EntryData.data() == nullptr)
                throw ZipRuntimeError(mz_zip_get_error_string(m_Archive.m_last_error));

            // ===== Return ZipEntry object with the file data.
            return ZipEntry(&*result);
        }